

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraintSolver.cpp
# Opt level: O1

void __thiscall
btMultiBodyConstraintSolver::convertMultiBodyContact
          (btMultiBodyConstraintSolver *this,btPersistentManifold *manifold,
          btContactSolverInfo *infoGlobal)

{
  btVector3 *pbVar1;
  btMultiBodySolverConstraint *solverConstraint;
  float fVar2;
  int frictionIndex;
  btCollisionObject *body;
  btCollisionObject *body_00;
  void *pvVar3;
  long lVar4;
  btCollisionObject *pbVar5;
  long lVar6;
  btManifoldPoint *cp;
  int iVar7;
  btManifoldPoint *pbVar8;
  btCollisionObject *pbVar9;
  long lVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar11;
  float fVar12;
  btScalar in_XMM1_Da;
  btScalar in_XMM2_Da;
  float fVar13;
  float fVar14;
  btScalar bVar15;
  int local_84;
  int local_80;
  btScalar relaxation;
  undefined1 local_78 [16];
  btMultiBody *local_60;
  _func_int **local_58;
  btContactSolverInfo *local_50;
  btManifoldPoint *local_48;
  btCollisionObject *local_40;
  btCollisionObject *local_38;
  
  body = manifold->m_body0;
  body_00 = manifold->m_body1;
  pbVar5 = body;
  if ((body->m_internalType & 0x40) == 0) {
    pbVar5 = (btCollisionObject *)0x0;
  }
  local_58 = (_func_int **)0x0;
  pbVar9 = body_00;
  if ((body_00->m_internalType & 0x40) == 0) {
    pbVar9 = (btCollisionObject *)0x0;
  }
  if (pbVar5 != (btCollisionObject *)0x0) {
    local_58 = pbVar5[1]._vptr_btCollisionObject;
  }
  if (pbVar9 == (btCollisionObject *)0x0) {
    local_60 = (btMultiBody *)0x0;
  }
  else {
    local_60 = (btMultiBody *)pbVar9[1]._vptr_btCollisionObject;
  }
  local_80 = -1;
  local_84 = -1;
  if (local_58 == (_func_int **)0x0) {
    local_84 = btSequentialImpulseConstraintSolver::getOrInitSolverBody
                         (&this->super_btSequentialImpulseConstraintSolver,body,
                          (infoGlobal->super_btContactSolverInfoData).m_timeStep);
  }
  local_40 = pbVar9;
  local_38 = pbVar5;
  if (local_60 == (btMultiBody *)0x0) {
    local_80 = btSequentialImpulseConstraintSolver::getOrInitSolverBody
                         (&this->super_btSequentialImpulseConstraintSolver,body_00,
                          (infoGlobal->super_btContactSolverInfoData).m_timeStep);
  }
  if (0 < manifold->m_cachedPoints) {
    pbVar8 = manifold->m_pointCache;
    lVar6 = 0;
    local_50 = infoGlobal;
    local_48 = pbVar8;
    do {
      fVar13 = manifold->m_contactProcessingThreshold;
      if (pbVar8[lVar6].m_distance1 <= fVar13) {
        frictionIndex = *(int *)&this->field_0x16c;
        if (frictionIndex == *(int *)&this->field_0x170) {
          iVar7 = frictionIndex * 2;
          if (frictionIndex == 0) {
            iVar7 = 1;
          }
          if (*(int *)&this->field_0x170 < iVar7) {
            local_78._0_4_ = iVar7;
            if (iVar7 == 0) {
              pvVar3 = (void *)0x0;
            }
            else {
              pvVar3 = btAlignedAllocInternal((long)iVar7 * 0xe0,0x10);
              fVar13 = extraout_XMM0_Da;
            }
            iVar7 = *(int *)&this->field_0x16c;
            if (0 < (long)iVar7) {
              lVar10 = 0;
              do {
                memcpy((void *)(lVar10 + (long)pvVar3),
                       (void *)(*(long *)&this->field_0x178 + lVar10),0xe0);
                lVar10 = lVar10 + 0xe0;
                fVar13 = extraout_XMM0_Da_00;
              } while ((long)iVar7 * 0xe0 - lVar10 != 0);
            }
            pbVar8 = local_48;
            infoGlobal = local_50;
            if (*(void **)&this->field_0x178 != (void *)0x0) {
              if (this->field_0x180 == '\x01') {
                btAlignedFreeInternal(*(void **)&this->field_0x178);
                fVar13 = extraout_XMM0_Da_01;
              }
              *(undefined8 *)&this->field_0x178 = 0;
            }
            this->field_0x180 = 1;
            *(void **)&this->field_0x178 = pvVar3;
            *(undefined4 *)&this->field_0x170 = local_78._0_4_;
          }
        }
        *(int *)&this->field_0x16c = *(int *)&this->field_0x16c + 1;
        lVar10 = *(long *)&this->field_0x178;
        lVar4 = (long)frictionIndex * 0xe0;
        solverConstraint = (btMultiBodySolverConstraint *)(lVar10 + lVar4);
        *(undefined8 *)(lVar10 + 0xd0 + lVar4) = 0;
        *(undefined4 *)(lVar10 + 0xd8 + lVar4) = 0xffffffff;
        *(int *)(lVar10 + 0xa8 + lVar4) = local_84;
        *(int *)(lVar10 + 0xbc + lVar4) = local_80;
        *(_func_int ***)(lVar10 + 0xb0 + lVar4) = local_58;
        if (local_58 != (_func_int **)0x0) {
          solverConstraint->m_linkA = (int)local_38[1].m_worldTransform.m_basis.m_el[0].m_floats[0];
        }
        solverConstraint->m_multiBodyB = local_60;
        if (local_60 != (btMultiBody *)0x0) {
          solverConstraint->m_linkB = (int)local_40[1].m_worldTransform.m_basis.m_el[0].m_floats[0];
        }
        cp = pbVar8 + lVar6;
        (solverConstraint->field_19).m_originalContactPoint = cp;
        setupMultiBodyContactConstraint
                  (this,solverConstraint,&cp->m_normalWorldOnB,cp,infoGlobal,&relaxation,false,
                   fVar13,in_XMM1_Da);
        solverConstraint->m_frictionIndex = frictionIndex;
        if ((((infoGlobal->super_btContactSolverInfoData).m_solverMode & 0x20) == 0) ||
           (cp->m_lateralFrictionInitialized == false)) {
          fVar13 = (cp->m_normalWorldOnB).m_floats[2];
          if (ABS(fVar13) <= 0.70710677) {
            fVar13 = (cp->m_normalWorldOnB).m_floats[0];
            fVar11 = (cp->m_normalWorldOnB).m_floats[1];
            fVar13 = fVar13 * fVar13 + fVar11 * fVar11;
            if (fVar13 < 0.0) {
              local_78 = ZEXT416((uint)fVar13);
              fVar11 = sqrtf(fVar13);
              fVar13 = (float)local_78._0_4_;
            }
            else {
              fVar11 = SQRT(fVar13);
            }
            fVar11 = 1.0 / fVar11;
            fVar2 = (cp->m_normalWorldOnB).m_floats[0];
            fVar12 = (cp->m_normalWorldOnB).m_floats[1];
            fVar14 = (cp->m_normalWorldOnB).m_floats[2];
            (cp->m_lateralFrictionDir1).m_floats[2] = 0.0;
            bVar15 = fVar13 * fVar11;
            in_XMM1_Da = fVar11 * fVar2;
            fVar11 = fVar11 * -fVar12;
            (cp->m_lateralFrictionDir1).m_floats[0] = fVar11;
            (cp->m_lateralFrictionDir1).m_floats[1] = in_XMM1_Da;
            in_XMM2_Da = -fVar14 * in_XMM1_Da;
            *(ulong *)(cp->m_lateralFrictionDir2).m_floats = CONCAT44(fVar14 * fVar11,in_XMM2_Da);
          }
          else {
            fVar11 = (cp->m_normalWorldOnB).m_floats[1];
            fVar13 = fVar11 * fVar11 + fVar13 * fVar13;
            if (fVar13 < 0.0) {
              local_78 = ZEXT416((uint)fVar13);
              fVar11 = sqrtf(fVar13);
              fVar13 = (float)local_78._0_4_;
            }
            else {
              fVar11 = SQRT(fVar13);
            }
            fVar11 = 1.0 / fVar11;
            (cp->m_lateralFrictionDir1).m_floats[0] = 0.0;
            fVar14 = -(cp->m_normalWorldOnB).m_floats[2] * fVar11;
            (cp->m_lateralFrictionDir1).m_floats[1] = fVar14;
            fVar12 = (cp->m_normalWorldOnB).m_floats[1] * fVar11;
            (cp->m_lateralFrictionDir1).m_floats[2] = fVar12;
            fVar2 = (cp->m_normalWorldOnB).m_floats[0];
            bVar15 = fVar14 * fVar2;
            in_XMM2_Da = -fVar2;
            in_XMM1_Da = fVar11 * fVar13;
            *(ulong *)(cp->m_lateralFrictionDir2).m_floats =
                 CONCAT44(fVar12 * in_XMM2_Da,in_XMM1_Da);
          }
          pbVar1 = &cp->m_lateralFrictionDir1;
          (cp->m_lateralFrictionDir2).m_floats[2] = bVar15;
          btSequentialImpulseConstraintSolver::applyAnisotropicFriction(body,pbVar1,1);
          btSequentialImpulseConstraintSolver::applyAnisotropicFriction(body_00,pbVar1,1);
          infoGlobal = local_50;
          local_78._0_4_ = relaxation;
          addMultiBodyFrictionConstraint
                    (this,pbVar1,manifold,frictionIndex,cp,body,body_00,relaxation,local_50,
                     in_XMM1_Da,in_XMM2_Da);
          if (((infoGlobal->super_btContactSolverInfoData).m_solverMode & 0x10) != 0) {
            pbVar1 = &cp->m_lateralFrictionDir2;
            btSequentialImpulseConstraintSolver::applyAnisotropicFriction(body,pbVar1,1);
            btSequentialImpulseConstraintSolver::applyAnisotropicFriction(body_00,pbVar1,1);
            infoGlobal = local_50;
            addMultiBodyFrictionConstraint
                      (this,pbVar1,manifold,frictionIndex,cp,body,body_00,(btScalar)local_78._0_4_,
                       local_50,in_XMM1_Da,in_XMM2_Da);
          }
          pbVar8 = local_48;
          if ((~(infoGlobal->super_btContactSolverInfoData).m_solverMode & 0x50U) == 0) {
            cp->m_lateralFrictionInitialized = true;
          }
        }
        else {
          local_78._0_4_ = relaxation;
          addMultiBodyFrictionConstraint
                    (this,&cp->m_lateralFrictionDir1,manifold,frictionIndex,cp,body,body_00,
                     relaxation,infoGlobal,in_XMM1_Da,in_XMM2_Da);
          if (((infoGlobal->super_btContactSolverInfoData).m_solverMode & 0x10) != 0) {
            addMultiBodyFrictionConstraint
                      (this,&cp->m_lateralFrictionDir2,manifold,frictionIndex,cp,body,body_00,
                       (btScalar)local_78._0_4_,infoGlobal,in_XMM1_Da,in_XMM2_Da);
          }
          solverConstraint->m_appliedPushImpulse = 0.0;
          solverConstraint->m_appliedImpulse = 0.0;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < manifold->m_cachedPoints);
  }
  return;
}

Assistant:

void	btMultiBodyConstraintSolver::convertMultiBodyContact(btPersistentManifold* manifold,const btContactSolverInfo& infoGlobal)
{
	const btMultiBodyLinkCollider* fcA = btMultiBodyLinkCollider::upcast(manifold->getBody0());
	const btMultiBodyLinkCollider* fcB = btMultiBodyLinkCollider::upcast(manifold->getBody1());
	
	btMultiBody* mbA = fcA? fcA->m_multiBody : 0;
	btMultiBody* mbB = fcB? fcB->m_multiBody : 0;

	btCollisionObject* colObj0=0,*colObj1=0;

	colObj0 = (btCollisionObject*)manifold->getBody0();
	colObj1 = (btCollisionObject*)manifold->getBody1();

	int solverBodyIdA = mbA? -1 : getOrInitSolverBody(*colObj0,infoGlobal.m_timeStep);
	int solverBodyIdB = mbB ? -1 : getOrInitSolverBody(*colObj1,infoGlobal.m_timeStep);

//	btSolverBody* solverBodyA = mbA ? 0 : &m_tmpSolverBodyPool[solverBodyIdA];
//	btSolverBody* solverBodyB = mbB ? 0 : &m_tmpSolverBodyPool[solverBodyIdB];


	///avoid collision response between two static objects
//	if (!solverBodyA || (solverBodyA->m_invMass.isZero() && (!solverBodyB || solverBodyB->m_invMass.isZero())))
	//	return;



	for (int j=0;j<manifold->getNumContacts();j++)
	{

		btManifoldPoint& cp = manifold->getContactPoint(j);

		if (cp.getDistance() <= manifold->getContactProcessingThreshold())
		{
		
			btScalar relaxation;

			int frictionIndex = m_multiBodyNormalContactConstraints.size();

			btMultiBodySolverConstraint& solverConstraint = m_multiBodyNormalContactConstraints.expandNonInitializing();

	//		btRigidBody* rb0 = btRigidBody::upcast(colObj0);
	//		btRigidBody* rb1 = btRigidBody::upcast(colObj1);
            solverConstraint.m_orgConstraint = 0;
            solverConstraint.m_orgDofIndex = -1;
			solverConstraint.m_solverBodyIdA = solverBodyIdA;
			solverConstraint.m_solverBodyIdB = solverBodyIdB;
			solverConstraint.m_multiBodyA = mbA;
			if (mbA)
				solverConstraint.m_linkA = fcA->m_link;

			solverConstraint.m_multiBodyB = mbB;
			if (mbB)
				solverConstraint.m_linkB = fcB->m_link;

			solverConstraint.m_originalContactPoint = &cp;

			bool isFriction = false;
			setupMultiBodyContactConstraint(solverConstraint, cp.m_normalWorldOnB,cp, infoGlobal, relaxation, isFriction);

//			const btVector3& pos1 = cp.getPositionWorldOnA();
//			const btVector3& pos2 = cp.getPositionWorldOnB();

			/////setup the friction constraints
#define ENABLE_FRICTION
#ifdef ENABLE_FRICTION
			solverConstraint.m_frictionIndex = frictionIndex;
#if ROLLING_FRICTION
	int rollingFriction=1;
			btVector3 angVelA(0,0,0),angVelB(0,0,0);
			if (rb0)
				angVelA = rb0->getAngularVelocity();
			if (rb1)
				angVelB = rb1->getAngularVelocity();
			btVector3 relAngVel = angVelB-angVelA;

			if ((cp.m_combinedRollingFriction>0.f) && (rollingFriction>0))
			{
				//only a single rollingFriction per manifold
				rollingFriction--;
				if (relAngVel.length()>infoGlobal.m_singleAxisRollingFrictionThreshold)
				{
					relAngVel.normalize();
					applyAnisotropicFriction(colObj0,relAngVel,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,relAngVel,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					if (relAngVel.length()>0.001)
						addRollingFrictionConstraint(relAngVel,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

				} else
				{
					addRollingFrictionConstraint(cp.m_normalWorldOnB,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
					btVector3 axis0,axis1;
					btPlaneSpace1(cp.m_normalWorldOnB,axis0,axis1);
					applyAnisotropicFriction(colObj0,axis0,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,axis0,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj0,axis1,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					applyAnisotropicFriction(colObj1,axis1,btCollisionObject::CF_ANISOTROPIC_ROLLING_FRICTION);
					if (axis0.length()>0.001)
						addRollingFrictionConstraint(axis0,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
					if (axis1.length()>0.001)
						addRollingFrictionConstraint(axis1,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);
		
				}
			}
#endif //ROLLING_FRICTION

			///Bullet has several options to set the friction directions
			///By default, each contact has only a single friction direction that is recomputed automatically very frame 
			///based on the relative linear velocity.
			///If the relative velocity it zero, it will automatically compute a friction direction.
			
			///You can also enable two friction directions, using the SOLVER_USE_2_FRICTION_DIRECTIONS.
			///In that case, the second friction direction will be orthogonal to both contact normal and first friction direction.
			///
			///If you choose SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION, then the friction will be independent from the relative projected velocity.
			///
			///The user can manually override the friction directions for certain contacts using a contact callback, 
			///and set the cp.m_lateralFrictionInitialized to true
			///In that case, you can set the target relative motion in each friction direction (cp.m_contactMotion1 and cp.m_contactMotion2)
			///this will give a conveyor belt effect
			///
			if (!(infoGlobal.m_solverMode & SOLVER_ENABLE_FRICTION_DIRECTION_CACHING) || !cp.m_lateralFrictionInitialized)
			{/*
				cp.m_lateralFrictionDir1 = vel - cp.m_normalWorldOnB * rel_vel;
				btScalar lat_rel_vel = cp.m_lateralFrictionDir1.length2();
				if (!(infoGlobal.m_solverMode & SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION) && lat_rel_vel > SIMD_EPSILON)
				{
					cp.m_lateralFrictionDir1 *= 1.f/btSqrt(lat_rel_vel);
					if((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					{
						cp.m_lateralFrictionDir2 = cp.m_lateralFrictionDir1.cross(cp.m_normalWorldOnB);
						cp.m_lateralFrictionDir2.normalize();//??
						applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

					}

					applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,solverBodyIdA,solverBodyIdB,frictionIndex,cp,rel_pos1,rel_pos2,colObj0,colObj1, relaxation);

				} else
				*/
				{
					btPlaneSpace1(cp.m_normalWorldOnB,cp.m_lateralFrictionDir1,cp.m_lateralFrictionDir2);

					applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir1,btCollisionObject::CF_ANISOTROPIC_FRICTION);
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal);

					if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					{
						applyAnisotropicFriction(colObj0,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						applyAnisotropicFriction(colObj1,cp.m_lateralFrictionDir2,btCollisionObject::CF_ANISOTROPIC_FRICTION);
						addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal);
					}

					if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS) && (infoGlobal.m_solverMode & SOLVER_DISABLE_VELOCITY_DEPENDENT_FRICTION_DIRECTION))
					{
						cp.m_lateralFrictionInitialized = true;
					}
				}

			} else
			{
				addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir1,manifold,frictionIndex,cp,colObj0,colObj1, relaxation,infoGlobal,cp.m_contactMotion1, cp.m_contactCFM1);

				if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
					addMultiBodyFrictionConstraint(cp.m_lateralFrictionDir2,manifold,frictionIndex,cp,colObj0,colObj1, relaxation, infoGlobal,cp.m_contactMotion2, cp.m_contactCFM2);

				//setMultiBodyFrictionConstraintImpulse( solverConstraint, solverBodyIdA, solverBodyIdB, cp, infoGlobal);
				//todo:
				solverConstraint.m_appliedImpulse = 0.f;
				solverConstraint.m_appliedPushImpulse = 0.f;
			}
		

#endif //ENABLE_FRICTION

		}
	}
}